

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crt_abstractions.c
# Opt level: O1

int strcat_s(char *dst,size_t dstSizeInBytes,char *src)

{
  size_t __n;
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  int iVar4;
  
  if (dst == (char *)0x0) {
    return 0x16;
  }
  if (src == (char *)0x0) {
    iVar4 = 0x16;
  }
  else {
    iVar4 = 0x22;
    if (dstSizeInBytes != 0) {
      __n = strlen(src);
      sVar1 = 0;
      do {
        sVar2 = sVar1;
        if (dst[sVar1] == '\0') break;
        sVar1 = sVar1 + 1;
        sVar2 = dstSizeInBytes;
      } while (dstSizeInBytes != sVar1);
      uVar3 = dstSizeInBytes - sVar2;
      if (uVar3 == 0) {
        return 0x16;
      }
      if (sVar2 + __n < dstSizeInBytes) {
        if (uVar3 < __n) {
          __n = uVar3;
        }
        memcpy(dst + sVar2,src,__n);
        dst = dst + sVar2 + __n;
        iVar4 = 0;
      }
    }
  }
  *dst = '\0';
  return iVar4;
}

Assistant:

int strcat_s(char* dst, size_t dstSizeInBytes, const char* src)
{
    int result;
    /*Codes_SRS_CRT_ABSTRACTIONS_99_004: [If dst is NULL or unterminated, the error code returned shall be EINVAL & dst shall not be modified.]*/
    if (dst == NULL)
    {
        result = EINVAL;
    }
    /*Codes_SRS_CRT_ABSTRACTIONS_99_005: [If src is NULL, the error code returned shall be EINVAL and dst[0] shall be set to 0.]*/
    else if (src == NULL)
    {
        dst[0] = '\0';
        result = EINVAL;
    }
    else
    {
        /*Codes_SRS_CRT_ABSTRACTIONS_99_006: [If the dstSizeInBytes is 0 or smaller than the required size for dst & src, the error code returned shall be ERANGE & dst[0] set to 0.]*/
        if (dstSizeInBytes == 0)
        {
            result = ERANGE;
            dst[0] = '\0';
        }
        else
        {
            size_t dstStrLen = 0;
            size_t src_len = strlen(src);
#ifdef __STDC_LIB_EXT1__
            dstStrLen = strnlen_s(dst, dstSizeInBytes);
#else
            size_t i;
            for(i=0; (i < dstSizeInBytes) && (dst[i]!= '\0'); i++)
            {
            }
            dstStrLen = i;
#endif
            /*Codes_SRS_CRT_ABSTRACTIONS_99_004: [If dst is NULL or unterminated, the error code returned shall be EINVAL & dst shall not be modified.]*/
            if (dstSizeInBytes == dstStrLen) /* this means the dst string is not terminated*/
            {
                result = EINVAL;
            }
            // If we are instructed to write too much data to the buffer
            // return ERANGE
            else if ((src_len + dstStrLen) >= dstSizeInBytes)
            {
                dst[0] = '\0';
                result = ERANGE;
            }
            else
            {
                // memcpy should at most copy the result of strlen(src) or there may be
                // some issues with copying unwanted memory
                size_t bytes_to_cpy = dstSizeInBytes - dstStrLen;
                if (bytes_to_cpy > src_len)
                {
                    bytes_to_cpy = src_len;
                }

                /*Codes_SRS_CRT_ABSTRACTIONS_99_009: [The initial character of src shall overwrite the terminating null character of dst.]*/
                if (memcpy(&dst[dstStrLen], src, bytes_to_cpy) == NULL)
                /*Codes_SRS_CRT_ABSTRACTIONS_99_006: [If the dstSizeInBytes is 0 or smaller than the required size for dst & src, the error code returned shall be ERANGE & dst[0] set to 0.]*/
                {
                    dst[0] = '\0';
                    result = ERANGE;
                }
                else
                {
                    /*Codes_SRS_CRT_ABSTRACTIONS_99_003: [strcat_s shall return Zero upon success.]*/
                    dst[dstStrLen+bytes_to_cpy] = '\0';
                    result = 0;
                }
            }
        }
    }
    return result;
}